

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu.c
# Opt level: O1

_Bool GPU_IntersectRect(GPU_Rect A,GPU_Rect B,GPU_Rect *result)

{
  _Bool _Var1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  
  _Var1 = false;
  if ((((0.0 < A.w) && (0.0 < A.h)) && (0.0 < B.w)) && (0.0 < B.h)) {
    fVar6 = A.x;
    fVar3 = A.w + fVar6;
    fVar4 = B.x;
    fVar5 = B.w + fVar4;
    if (fVar3 <= fVar5) {
      fVar5 = fVar3;
    }
    if (fVar4 <= fVar6) {
      fVar4 = fVar6;
    }
    _Var1 = false;
    if (fVar4 < fVar5) {
      fVar2 = A.y;
      fVar7 = A.h + fVar2;
      fVar3 = B.y;
      fVar6 = B.h + fVar3;
      if (fVar7 <= fVar6) {
        fVar6 = fVar7;
      }
      if (fVar3 <= fVar2) {
        fVar3 = fVar2;
      }
      if ((fVar3 < fVar6) && (_Var1 = true, result != (GPU_Rect *)0x0)) {
        result->x = fVar4;
        result->y = fVar3;
        result->w = fVar5 - fVar4;
        result->h = fVar6 - fVar3;
      }
    }
  }
  return _Var1;
}

Assistant:

GPU_bool GPU_IntersectRect(GPU_Rect A, GPU_Rect B, GPU_Rect* result)
{
    GPU_bool has_horiz_intersection = GPU_FALSE;
    float Amin, Amax, Bmin, Bmax;
    GPU_Rect intersection;

    // Special case for empty rects
    if (A.w <= 0.0f || A.h <= 0.0f || B.w <= 0.0f || B.h <= 0.0f)
        return GPU_FALSE;

    // Horizontal intersection
    Amin = A.x;
    Amax = Amin + A.w;
    Bmin = B.x;
    Bmax = Bmin + B.w;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.x = Amin;
    intersection.w = Amax - Amin;
    
    has_horiz_intersection = (Amax > Amin);

    // Vertical intersection
    Amin = A.y;
    Amax = Amin + A.h;
    Bmin = B.y;
    Bmax = Bmin + B.h;
    if (Bmin > Amin)
        Amin = Bmin;
    if (Bmax < Amax)
        Amax = Bmax;
    
    intersection.y = Amin;
    intersection.h = Amax - Amin;
    
    if(has_horiz_intersection && Amax > Amin)
    {
        if(result != NULL)
            *result = intersection;
        return GPU_TRUE;
    }
    else
        return GPU_FALSE;
}